

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void lj_parse_keepcdata(LexState *ls,TValue *tv,GCcdata *cd)

{
  lua_State *L;
  TValue *pTVar1;
  
  L = ls->L;
  (tv->u32).lo = (uint32_t)cd;
  (tv->field_2).it = 0xfffffff5;
  pTVar1 = lj_tab_set(L,ls->fs->kt,tv);
  (pTVar1->field_2).it = 0xfffffffd;
  return;
}

Assistant:

void lj_parse_keepcdata(LexState *ls, TValue *tv, GCcdata *cd)
{
  /* NOBARRIER: the key is new or kept alive. */
  lua_State *L = ls->L;
  setcdataV(L, tv, cd);
  setboolV(lj_tab_set(L, ls->fs->kt, tv), 1);
}